

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

size_t mpack_node_map_count(mpack_node_t node)

{
  if ((node.tree)->error != mpack_ok) {
    return 0;
  }
  if ((node.data)->type == mpack_type_map) {
    return (ulong)(node.data)->len;
  }
  mpack_tree_flag_error(node.tree,mpack_error_type);
  return 0;
}

Assistant:

MPACK_INLINE size_t mpack_node_map_count(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    return node.data->len;
}